

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3_pack4to1.h
# Opt level: O0

void ncnn::conv3x3s1_winograd63_transform_kernel_pack4to1_sse
               (Mat *kernel,Mat *kernel_tm_pack4,int inch,int outch,Option *opt)

{
  int in_ECX;
  long lVar1;
  int in_EDX;
  long *in_RSI;
  long *in_RDI;
  float *k03_1;
  float *k02_1;
  float *k01_1;
  float *k00_1;
  int q_2;
  float *g00_1;
  int k_1;
  Mat g0_1;
  Mat k0_2;
  float *k33;
  float *k32;
  float *k31;
  float *k30;
  float *k23;
  float *k22;
  float *k21;
  float *k20;
  float *k13;
  float *k12;
  float *k11;
  float *k10;
  float *k03;
  float *k02;
  float *k01;
  float *k00;
  int q_1;
  float *g00;
  int k;
  Mat g0;
  Mat k3;
  Mat k2_1;
  Mat k1_1;
  Mat k0_1;
  int p;
  int i_1;
  float *tmpp;
  int j;
  int i;
  float tmp [8] [3];
  float *k2;
  float *k1;
  float *k0;
  float *kernel_tm0;
  float *kernel0;
  int q;
  int p_1;
  float ktm [8] [3];
  Mat kernel_tm;
  Mat *m_7;
  Mat *m_6;
  Mat *m_5;
  Mat *m_4;
  Mat *m_3;
  Mat *m_2;
  Mat *m_1;
  Mat *m;
  Allocator *in_stack_fffffffffffff200;
  int _elempack;
  void **ppvVar2;
  size_t in_stack_fffffffffffff208;
  undefined8 in_stack_fffffffffffff210;
  int _c;
  undefined8 in_stack_fffffffffffff218;
  Mat *in_stack_fffffffffffff220;
  Allocator *in_stack_fffffffffffff280;
  int local_c14;
  undefined4 *local_c10;
  int local_c04;
  undefined8 local_c00;
  undefined8 local_bf8;
  undefined8 local_bf0;
  undefined4 local_be8;
  long local_be0;
  undefined4 local_bd8;
  undefined4 local_bd4;
  undefined4 local_bd0;
  undefined4 local_bcc;
  undefined4 local_bc8;
  undefined8 local_bc0;
  undefined8 local_bb8;
  undefined8 local_bb0;
  undefined8 local_ba8;
  undefined4 local_ba0;
  long *local_b98;
  undefined4 local_b90;
  undefined4 local_b8c;
  undefined4 local_b88;
  undefined4 local_b84;
  undefined4 local_b80;
  undefined8 local_b78;
  void *local_b70;
  void *local_b68;
  void *local_b60;
  void *local_b58;
  void *local_b50;
  void *local_b48;
  void *local_b40;
  void *local_b38;
  void *local_b30;
  void *local_b28;
  void *local_b20;
  void *local_b18;
  void *local_b10;
  void *local_b08;
  void *local_b00;
  void *local_af8;
  int local_aec;
  undefined4 *local_ae8;
  int local_adc;
  undefined8 local_ad8;
  undefined8 local_ad0;
  undefined8 local_ac8;
  undefined4 local_ac0;
  long local_ab8;
  undefined4 local_ab0;
  undefined4 local_aac;
  undefined4 local_aa8;
  undefined4 local_aa4;
  undefined4 local_aa0;
  undefined8 local_a98;
  undefined8 local_a90;
  undefined8 local_a88;
  undefined8 local_a80;
  undefined4 local_a78;
  long *local_a70;
  undefined4 local_a68;
  undefined4 local_a64;
  undefined4 local_a60;
  undefined4 local_a5c;
  undefined4 local_a58;
  undefined8 local_a50;
  undefined8 local_a48;
  undefined8 local_a40;
  undefined8 local_a38;
  undefined4 local_a30;
  long *local_a28;
  undefined4 local_a20;
  undefined4 local_a1c;
  undefined4 local_a18;
  undefined4 local_a14;
  undefined4 local_a10;
  undefined8 local_a08;
  undefined8 local_a00;
  undefined8 local_9f8;
  undefined8 local_9f0;
  undefined4 local_9e8;
  long *local_9e0;
  undefined4 local_9d8;
  undefined4 local_9d4;
  undefined4 local_9d0;
  undefined4 local_9cc;
  undefined4 local_9c8;
  undefined8 local_9c0;
  undefined8 local_9b8;
  undefined8 local_9b0;
  undefined8 local_9a8;
  undefined4 local_9a0;
  long *local_998;
  undefined4 local_990;
  undefined4 local_98c;
  undefined4 local_988;
  undefined4 local_984;
  undefined4 local_980;
  undefined8 local_978;
  int local_970;
  int local_96c;
  float *local_968;
  int local_960;
  int local_95c;
  float local_958 [26];
  float *local_8f0;
  float *local_8e8;
  float *local_8e0;
  undefined8 local_8d8;
  undefined8 local_8d0;
  undefined8 local_8c8;
  undefined4 local_8c0;
  long *local_8b8;
  undefined4 local_8b0;
  undefined4 local_8ac;
  undefined4 local_8a8;
  undefined4 local_8a4;
  undefined4 local_8a0;
  undefined8 local_898;
  void *local_890;
  float *local_888;
  int local_880;
  int local_87c;
  float local_878 [28];
  void *local_808;
  int *local_800;
  long local_7f8;
  undefined4 local_7f0;
  long *local_7e8;
  undefined4 local_7e0;
  int local_7dc;
  int local_7d8;
  undefined4 local_7d4;
  undefined4 local_7d0;
  long local_7c8;
  int local_7b8;
  int local_7b4;
  long *local_7b0;
  long *local_7a8;
  void **local_7a0;
  undefined8 *local_798;
  undefined8 *local_790;
  undefined8 *local_780;
  undefined8 *local_770;
  undefined8 *local_760;
  undefined8 *local_750;
  undefined8 *local_740;
  undefined8 *local_730;
  void **local_720;
  int local_700;
  undefined4 local_6fc;
  void **local_6f8;
  undefined8 *local_6d8;
  undefined8 *local_6b8;
  undefined8 *local_698;
  undefined8 *local_678;
  undefined8 *local_658;
  undefined8 *local_638;
  undefined8 *local_618;
  undefined8 *local_608;
  undefined1 local_5fd;
  int local_5fc;
  undefined8 *local_5f0;
  undefined1 local_5cd;
  int local_5cc;
  void **local_5c8;
  undefined8 *local_5c0;
  undefined1 local_59d;
  int local_59c;
  undefined8 *local_590;
  undefined1 local_56d;
  int local_56c;
  void **local_568;
  undefined8 *local_560;
  undefined1 local_53d;
  int local_53c;
  void **local_538;
  undefined8 *local_530;
  undefined1 local_50d;
  int local_50c;
  void **local_508;
  undefined8 *local_500;
  undefined1 local_4dd;
  int local_4dc;
  void **local_4d8;
  undefined8 *local_4d0;
  undefined1 local_4ad;
  int local_4ac;
  void **local_4a8;
  undefined8 *local_4a0;
  int local_474;
  undefined8 *local_470;
  int local_464;
  undefined8 *local_460;
  int local_454;
  undefined8 *local_450;
  int local_444;
  undefined8 *local_440;
  int local_434;
  undefined8 *local_430;
  int local_424;
  undefined8 *local_420;
  int local_414;
  undefined8 *local_410;
  int local_404;
  undefined8 *local_400;
  int local_3f4;
  undefined8 *local_3f0;
  int local_3e4;
  undefined8 *local_3e0;
  int local_3d4;
  undefined8 *local_3d0;
  int local_3c4;
  undefined8 *local_3c0;
  int local_3b4;
  undefined8 *local_3b0;
  int local_3a4;
  undefined8 *local_3a0;
  int local_394;
  undefined8 *local_390;
  int local_384;
  undefined8 *local_380;
  int local_374;
  undefined8 *local_370;
  int local_364;
  undefined8 *local_360;
  int local_354;
  undefined8 *local_350;
  int local_344;
  undefined8 *local_340;
  void *local_280;
  int local_26c;
  undefined8 *local_268;
  int local_25c;
  undefined8 *local_258;
  int local_24c;
  undefined8 *local_248;
  long *local_240;
  undefined4 local_234;
  long local_230;
  void *local_228;
  undefined4 local_21c;
  int local_218;
  int local_214;
  undefined8 *local_210;
  long *local_208;
  undefined4 local_1fc;
  long local_1f8;
  void *local_1f0;
  undefined4 local_1e4;
  int local_1e0;
  int local_1dc;
  undefined8 *local_1d8;
  long *local_1d0;
  undefined4 local_1c4;
  long local_1c0;
  void *local_1b8;
  undefined4 local_1ac;
  int local_1a8;
  int local_1a4;
  undefined8 *local_1a0;
  long *local_198;
  undefined4 local_18c;
  long local_188;
  void *local_180;
  undefined4 local_174;
  int local_170;
  int local_16c;
  undefined8 *local_168;
  long *local_160;
  undefined4 local_154;
  long local_150;
  void *local_148;
  undefined4 local_13c;
  int local_138;
  int local_134;
  undefined8 *local_130;
  long local_128;
  undefined4 local_11c;
  long local_118;
  long local_110;
  undefined4 local_104;
  int local_100;
  int local_fc;
  undefined8 *local_f8;
  long *local_f0;
  undefined4 local_e4;
  long local_e0;
  void *local_d8;
  undefined4 local_cc;
  int local_c8;
  int local_c4;
  undefined8 *local_c0;
  long local_b8;
  undefined4 local_ac;
  long local_a8;
  long local_a0;
  undefined4 local_94;
  int local_90;
  int local_8c;
  undefined8 *local_88;
  undefined4 local_7c;
  long local_78;
  undefined4 local_6c;
  long local_68;
  undefined4 local_5c;
  long local_58;
  undefined4 local_4c;
  long local_48;
  undefined4 local_3c;
  long local_38;
  undefined4 local_2c;
  long local_28;
  undefined4 local_1c;
  long local_18;
  undefined4 local_c;
  long local_8;
  
  _c = (int)((ulong)in_stack_fffffffffffff210 >> 0x20);
  local_7a0 = &local_808;
  local_808 = (void *)0x0;
  local_800 = (int *)0x0;
  local_7f8 = 0;
  local_7f0 = 0;
  local_7e8 = (long *)0x0;
  local_7e0 = 0;
  local_7dc = 0;
  local_7d8 = 0;
  local_7d4 = 0;
  local_7d0 = 0;
  local_7c8 = 0;
  local_7b8 = in_ECX;
  local_7b4 = in_EDX;
  local_7b0 = in_RSI;
  local_7a8 = in_RDI;
  Mat::create(in_stack_fffffffffffff220,(int)((ulong)in_stack_fffffffffffff218 >> 0x20),
              (int)in_stack_fffffffffffff218,_c,in_stack_fffffffffffff208,in_stack_fffffffffffff200)
  ;
  _elempack = (int)((ulong)in_stack_fffffffffffff200 >> 0x20);
  memcpy(local_878,&DAT_01f0e120,0x60);
  for (local_87c = 0; local_87c < local_7b8; local_87c = local_87c + 1) {
    for (local_880 = 0; local_880 < local_7b4; local_880 = local_880 + 1) {
      local_8e0 = (float *)(*local_7a8 + (long)(local_87c * local_7b4 * 9) * 4 +
                           (long)(local_880 * 9) * 4);
      local_4a0 = &local_8d8;
      local_4a8 = &local_808;
      local_228 = (void *)((long)local_808 + local_7c8 * local_87c * local_7f8);
      local_210 = &local_8d8;
      local_8 = (long)local_7dc * (long)local_7d8 * local_7f8;
      local_8b8 = local_7e8;
      local_c = 0x10;
      local_214 = local_7dc;
      local_218 = local_7d8;
      local_21c = local_7d4;
      local_230 = local_7f8;
      local_234 = local_7f0;
      local_240 = local_7e8;
      local_4ac = local_87c;
      local_4ad = 1;
      local_248 = &local_8d8;
      local_24c = local_880;
      local_890 = (void *)((long)local_228 + (long)local_7dc * (long)local_880 * local_7f8);
      local_798 = &local_8d8;
      local_8d8 = 0;
      local_8c8 = 0;
      local_8c0 = 0;
      local_8b0 = 0;
      local_8ac = 0;
      local_8a8 = 0;
      local_8a4 = 0;
      local_8a0 = 0;
      local_898 = 0;
      local_8d0 = 0;
      local_8e8 = local_8e0 + 3;
      local_8f0 = local_8e0 + 6;
      for (local_95c = 0; local_95c < 8; local_95c = local_95c + 1) {
        local_958[(long)local_95c * 3] =
             *local_8e0 * local_878[(long)local_95c * 3] +
             local_8e0[1] * local_878[(long)local_95c * 3 + 1] +
             local_8e0[2] * local_878[(long)local_95c * 3 + 2];
        local_958[(long)local_95c * 3 + 1] =
             *local_8e8 * local_878[(long)local_95c * 3] +
             local_8e0[4] * local_878[(long)local_95c * 3 + 1] +
             local_8e0[5] * local_878[(long)local_95c * 3 + 2];
        local_958[(long)local_95c * 3 + 2] =
             *local_8f0 * local_878[(long)local_95c * 3] +
             local_8e0[7] * local_878[(long)local_95c * 3 + 1] +
             local_8e0[8] * local_878[(long)local_95c * 3 + 2];
      }
      for (local_960 = 0; local_960 < 8; local_960 = local_960 + 1) {
        lVar1 = (long)local_960;
        local_968 = local_958 + lVar1 * 3;
        for (local_96c = 0; local_96c < 8; local_96c = local_96c + 1) {
          *(float *)((long)local_890 + (long)(local_960 * 8 + local_96c) * 4) =
               *local_968 * local_878[(long)local_96c * 3] +
               local_958[lVar1 * 3 + 1] * local_878[(long)local_96c * 3 + 1] +
               local_958[lVar1 * 3 + 2] * local_878[(long)local_96c * 3 + 2];
        }
      }
      local_888 = local_8e0;
      local_608 = local_798;
    }
  }
  Mat::create(in_stack_fffffffffffff220,(int)((ulong)in_stack_fffffffffffff218 >> 0x20),
              (int)in_stack_fffffffffffff218,_c,in_stack_fffffffffffff208,_elempack,
              in_stack_fffffffffffff280);
  for (local_970 = 0; local_970 + 3 < local_7b8; local_970 = local_970 + 4) {
    local_4d0 = &local_9b8;
    local_4d8 = &local_808;
    local_1f0 = (void *)((long)local_808 + local_7c8 * local_970 * local_7f8);
    local_1d8 = &local_9b8;
    local_18 = (long)local_7dc * (long)local_7d8 * local_7f8;
    local_50c = local_970 + 1;
    local_500 = &local_a00;
    local_508 = &local_808;
    local_1b8 = (void *)((long)local_808 + local_7c8 * local_50c * local_7f8);
    local_1a0 = &local_a00;
    local_28 = (long)local_7dc * (long)local_7d8 * local_7f8;
    local_53c = local_970 + 2;
    local_530 = &local_a48;
    local_538 = &local_808;
    local_180 = (void *)((long)local_808 + local_7c8 * local_53c * local_7f8);
    local_168 = &local_a48;
    local_38 = (long)local_7dc * (long)local_7d8 * local_7f8;
    local_56c = local_970 + 3;
    local_560 = &local_a90;
    local_568 = &local_808;
    local_148 = (void *)((long)local_808 + local_7c8 * local_56c * local_7f8);
    local_130 = &local_a90;
    local_48 = (long)local_7dc * (long)local_7d8 * local_7f8;
    local_59c = local_970 / 4;
    local_590 = &local_ad8;
    local_fc = *(int *)((long)local_7b0 + 0x2c);
    local_100 = (int)local_7b0[6];
    local_104 = *(undefined4 *)((long)local_7b0 + 0x34);
    local_110 = *local_7b0 + local_7b0[8] * (long)local_59c * local_7b0[2];
    local_118 = local_7b0[2];
    local_11c = (undefined4)local_7b0[3];
    local_128 = local_7b0[4];
    local_f8 = &local_ad8;
    local_58 = (long)local_fc * (long)local_100 * local_118;
    for (local_adc = 0; local_adc < 0x40; local_adc = local_adc + 1) {
      local_258 = &local_ad8;
      local_25c = local_adc;
      local_ae8 = (undefined4 *)(local_110 + (long)local_fc * (long)local_adc * local_118);
      for (local_aec = 0; local_aec + 3 < local_7b4; local_aec = local_aec + 4) {
        local_344 = local_aec;
        local_340 = &local_9b8;
        local_af8 = (void *)((long)local_1f0 + (long)local_7dc * (long)local_aec * local_7f8);
        local_354 = local_aec + 1;
        local_350 = &local_9b8;
        local_b00 = (void *)((long)local_1f0 + (long)local_7dc * (long)local_354 * local_7f8);
        local_364 = local_aec + 2;
        local_360 = &local_9b8;
        local_b08 = (void *)((long)local_1f0 + (long)local_7dc * (long)local_364 * local_7f8);
        local_374 = local_aec + 3;
        local_370 = &local_9b8;
        local_b10 = (void *)((long)local_1f0 + (long)local_7dc * (long)local_374 * local_7f8);
        local_384 = local_aec;
        local_380 = &local_a00;
        local_b18 = (void *)((long)local_1b8 + (long)local_7dc * (long)local_aec * local_7f8);
        local_394 = local_aec + 1;
        local_390 = &local_a00;
        local_b20 = (void *)((long)local_1b8 + (long)local_7dc * (long)local_394 * local_7f8);
        local_3a4 = local_aec + 2;
        local_3a0 = &local_a00;
        local_b28 = (void *)((long)local_1b8 + (long)local_7dc * (long)local_3a4 * local_7f8);
        local_3b4 = local_aec + 3;
        local_3b0 = &local_a00;
        local_b30 = (void *)((long)local_1b8 + (long)local_7dc * (long)local_3b4 * local_7f8);
        local_3c4 = local_aec;
        local_3c0 = &local_a48;
        local_b38 = (void *)((long)local_180 + (long)local_7dc * (long)local_aec * local_7f8);
        local_3d4 = local_aec + 1;
        local_3d0 = &local_a48;
        local_b40 = (void *)((long)local_180 + (long)local_7dc * (long)local_3d4 * local_7f8);
        local_3e4 = local_aec + 2;
        local_3e0 = &local_a48;
        local_b48 = (void *)((long)local_180 + (long)local_7dc * (long)local_3e4 * local_7f8);
        local_3f4 = local_aec + 3;
        local_3f0 = &local_a48;
        local_b50 = (void *)((long)local_180 + (long)local_7dc * (long)local_3f4 * local_7f8);
        local_404 = local_aec;
        local_400 = &local_a90;
        local_b58 = (void *)((long)local_148 + (long)local_7dc * (long)local_aec * local_7f8);
        local_414 = local_aec + 1;
        local_410 = &local_a90;
        local_b60 = (void *)((long)local_148 + (long)local_7dc * (long)local_414 * local_7f8);
        local_424 = local_aec + 2;
        local_420 = &local_a90;
        local_b68 = (void *)((long)local_148 + (long)local_7dc * (long)local_424 * local_7f8);
        local_434 = local_aec + 3;
        local_430 = &local_a90;
        local_b70 = (void *)((long)local_148 + (long)local_7dc * (long)local_434 * local_7f8);
        *local_ae8 = *(undefined4 *)((long)local_af8 + (long)local_adc * 4);
        local_ae8[1] = *(undefined4 *)((long)local_b18 + (long)local_adc * 4);
        local_ae8[2] = *(undefined4 *)((long)local_b38 + (long)local_adc * 4);
        local_ae8[3] = *(undefined4 *)((long)local_b58 + (long)local_adc * 4);
        local_ae8[4] = *(undefined4 *)((long)local_b00 + (long)local_adc * 4);
        local_ae8[5] = *(undefined4 *)((long)local_b20 + (long)local_adc * 4);
        local_ae8[6] = *(undefined4 *)((long)local_b40 + (long)local_adc * 4);
        local_ae8[7] = *(undefined4 *)((long)local_b60 + (long)local_adc * 4);
        local_ae8[8] = *(undefined4 *)((long)local_b08 + (long)local_adc * 4);
        local_ae8[9] = *(undefined4 *)((long)local_b28 + (long)local_adc * 4);
        local_ae8[10] = *(undefined4 *)((long)local_b48 + (long)local_adc * 4);
        local_ae8[0xb] = *(undefined4 *)((long)local_b68 + (long)local_adc * 4);
        local_ae8[0xc] = *(undefined4 *)((long)local_b10 + (long)local_adc * 4);
        local_ae8[0xd] = *(undefined4 *)((long)local_b30 + (long)local_adc * 4);
        local_ae8[0xe] = *(undefined4 *)((long)local_b50 + (long)local_adc * 4);
        local_ae8[0xf] = *(undefined4 *)((long)local_b70 + (long)local_adc * 4);
        local_ae8 = local_ae8 + 0x10;
      }
    }
    local_790 = &local_ad8;
    local_780 = &local_a90;
    local_770 = &local_a48;
    local_760 = &local_a00;
    local_998 = local_7e8;
    local_9e0 = local_7e8;
    local_a10 = 0;
    local_a14 = 0;
    local_a18 = 0;
    local_a1c = 0;
    local_a28 = local_7e8;
    local_a30 = 0;
    local_a38 = 0;
    local_a40 = 0;
    local_a48 = 0;
    local_a58 = 0;
    local_a5c = 0;
    local_a60 = 0;
    local_a64 = 0;
    local_a70 = local_7e8;
    local_a78 = 0;
    local_a80 = 0;
    local_a88 = 0;
    local_a90 = 0;
    local_aa0 = 0;
    local_aa4 = 0;
    local_aa8 = 0;
    local_aac = 0;
    local_ac0 = 0;
    local_ac8 = 0;
    local_ad0 = 0;
    local_ad8 = 0;
    local_1c = 0x10;
    local_2c = 0x10;
    local_3c = 0x10;
    local_4c = 0x10;
    local_5c = 0x10;
    local_134 = local_7dc;
    local_138 = local_7d8;
    local_13c = local_7d4;
    local_150 = local_7f8;
    local_154 = local_7f0;
    local_160 = local_7e8;
    local_16c = local_7dc;
    local_170 = local_7d8;
    local_174 = local_7d4;
    local_188 = local_7f8;
    local_18c = local_7f0;
    local_198 = local_7e8;
    local_1a4 = local_7dc;
    local_1a8 = local_7d8;
    local_1ac = local_7d4;
    local_1c0 = local_7f8;
    local_1c4 = local_7f0;
    local_1d0 = local_7e8;
    local_1dc = local_7dc;
    local_1e0 = local_7d8;
    local_1e4 = local_7d4;
    local_1f8 = local_7f8;
    local_1fc = local_7f0;
    local_208 = local_7e8;
    local_4dc = local_970;
    local_4dd = 1;
    local_50d = 1;
    local_53d = 1;
    local_56d = 1;
    local_59d = 1;
    local_a08 = 0;
    local_a20 = 0;
    local_a50 = 0;
    local_a68 = 0;
    local_a98 = 0;
    local_ab0 = 0;
    local_a00 = 0;
    local_9f0 = 0;
    local_9e8 = 0;
    local_9d8 = 0;
    local_9d4 = 0;
    local_9d0 = 0;
    local_9cc = 0;
    local_9c8 = 0;
    local_9c0 = 0;
    local_9f8 = 0;
    local_750 = &local_9b8;
    local_9b8 = 0;
    local_9a8 = 0;
    local_9a0 = 0;
    local_990 = 0;
    local_98c = 0;
    local_988 = 0;
    local_984 = 0;
    local_980 = 0;
    local_978 = 0;
    local_9b0 = 0;
    local_698 = local_750;
    local_678 = local_760;
    local_658 = local_770;
    local_638 = local_780;
    local_618 = local_790;
    local_ab8 = local_128;
  }
  for (; local_970 < local_7b8; local_970 = local_970 + 1) {
    local_5c0 = &local_bb8;
    local_5c8 = &local_808;
    local_d8 = (void *)((long)local_808 + local_7c8 * local_970 * local_7f8);
    local_c0 = &local_bb8;
    local_68 = (long)local_7dc * (long)local_7d8 * local_7f8;
    local_5fc = local_970 / 4 + local_970 % 4;
    local_5f0 = &local_c00;
    local_8c = *(int *)((long)local_7b0 + 0x2c);
    local_90 = (int)local_7b0[6];
    local_94 = *(undefined4 *)((long)local_7b0 + 0x34);
    local_a0 = *local_7b0 + local_7b0[8] * (long)local_5fc * local_7b0[2];
    local_a8 = local_7b0[2];
    local_ac = (undefined4)local_7b0[3];
    local_b8 = local_7b0[4];
    local_88 = &local_c00;
    local_78 = (long)local_8c * (long)local_90 * local_a8;
    for (local_c04 = 0; local_c04 < 0x40; local_c04 = local_c04 + 1) {
      local_268 = &local_c00;
      local_26c = local_c04;
      local_c10 = (undefined4 *)(local_a0 + (long)local_8c * (long)local_c04 * local_a8);
      for (local_c14 = 0; local_c14 + 3 < local_7b4; local_c14 = local_c14 + 4) {
        local_444 = local_c14;
        local_440 = &local_bb8;
        local_454 = local_c14 + 1;
        local_450 = &local_bb8;
        local_464 = local_c14 + 2;
        local_460 = &local_bb8;
        local_474 = local_c14 + 3;
        local_470 = &local_bb8;
        *local_c10 = *(undefined4 *)
                      ((long)local_d8 +
                      (long)local_c04 * 4 + (long)local_7dc * (long)local_c14 * local_7f8);
        local_c10[1] = *(undefined4 *)
                        ((long)local_d8 +
                        (long)local_c04 * 4 + (long)local_7dc * (long)local_454 * local_7f8);
        local_c10[2] = *(undefined4 *)
                        ((long)local_d8 +
                        (long)local_c04 * 4 + (long)local_7dc * (long)local_464 * local_7f8);
        local_c10[3] = *(undefined4 *)
                        ((long)local_d8 +
                        (long)local_c04 * 4 + (long)local_7dc * (long)local_474 * local_7f8);
        local_c10 = local_c10 + 4;
      }
    }
    local_740 = &local_c00;
    local_c00 = 0;
    local_bf0 = 0;
    local_be8 = 0;
    local_bd8 = 0;
    local_bd4 = 0;
    local_bd0 = 0;
    local_bcc = 0;
    local_bc8 = 0;
    local_bc0 = 0;
    local_bf8 = 0;
    local_730 = &local_bb8;
    local_b98 = local_7e8;
    local_6c = 0x10;
    local_7c = 0x10;
    local_c4 = local_7dc;
    local_c8 = local_7d8;
    local_cc = local_7d4;
    local_e0 = local_7f8;
    local_e4 = local_7f0;
    local_f0 = local_7e8;
    local_5cc = local_970;
    local_5cd = 1;
    local_5fd = 1;
    local_bb8 = 0;
    local_ba8 = 0;
    local_ba0 = 0;
    local_b90 = 0;
    local_b8c = 0;
    local_b88 = 0;
    local_b84 = 0;
    local_b80 = 0;
    local_b78 = 0;
    local_bb0 = 0;
    local_6d8 = local_730;
    local_6b8 = local_740;
    local_be0 = local_b8;
  }
  ppvVar2 = &local_808;
  if (local_800 != (int *)0x0) {
    local_6fc = 0xffffffff;
    LOCK();
    local_700 = *local_800;
    *local_800 = *local_800 + -1;
    UNLOCK();
    if (local_700 == 1) {
      local_720 = ppvVar2;
      local_6f8 = ppvVar2;
      if (local_7e8 == (long *)0x0) {
        local_280 = local_808;
        if (local_808 != (void *)0x0) {
          free(local_808);
        }
      }
      else {
        (**(code **)(*local_7e8 + 0x18))(local_7e8,local_808);
      }
    }
  }
  *ppvVar2 = (void *)0x0;
  ppvVar2[2] = (void *)0x0;
  *(undefined4 *)(ppvVar2 + 3) = 0;
  *(undefined4 *)(ppvVar2 + 5) = 0;
  *(undefined4 *)((long)ppvVar2 + 0x2c) = 0;
  *(undefined4 *)(ppvVar2 + 6) = 0;
  *(undefined4 *)((long)ppvVar2 + 0x34) = 0;
  *(undefined4 *)(ppvVar2 + 7) = 0;
  ppvVar2[8] = (void *)0x0;
  ppvVar2[1] = (void *)0x0;
  return;
}

Assistant:

static void conv3x3s1_winograd63_transform_kernel_pack4to1_sse(const Mat& kernel, Mat& kernel_tm_pack4, int inch, int outch, const Option& opt)
{
    // winograd63 transform kernel
    Mat kernel_tm;
    kernel_tm.create(8 * 8, inch, outch);

    const float ktm[8][3] = {
        {1.0f, 0.0f, 0.0f},
        {-2.0f / 9, -2.0f / 9, -2.0f / 9},
        {-2.0f / 9, 2.0f / 9, -2.0f / 9},
        {1.0f / 90, 1.0f / 45, 2.0f / 45},
        {1.0f / 90, -1.0f / 45, 2.0f / 45},
        {1.0f / 45, 1.0f / 90, 1.0f / 180},
        {1.0f / 45, -1.0f / 90, 1.0f / 180},
        {0.0f, 0.0f, 1.0f}
    };

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        for (int q = 0; q < inch; q++)
        {
            const float* kernel0 = (const float*)kernel + p * inch * 9 + q * 9;
            float* kernel_tm0 = kernel_tm.channel(p).row(q);

            // transform kernel, transposed
            const float* k0 = kernel0;
            const float* k1 = kernel0 + 3;
            const float* k2 = kernel0 + 6;

            // h
            float tmp[8][3];
            for (int i = 0; i < 8; i++)
            {
                tmp[i][0] = k0[0] * ktm[i][0] + k0[1] * ktm[i][1] + k0[2] * ktm[i][2];
                tmp[i][1] = k1[0] * ktm[i][0] + k1[1] * ktm[i][1] + k1[2] * ktm[i][2];
                tmp[i][2] = k2[0] * ktm[i][0] + k2[1] * ktm[i][1] + k2[2] * ktm[i][2];
            }

            // v
            for (int j = 0; j < 8; j++)
            {
                float* tmpp = &tmp[j][0];

                for (int i = 0; i < 8; i++)
                {
                    kernel_tm0[j * 8 + i] = tmpp[0] * ktm[i][0] + tmpp[1] * ktm[i][1] + tmpp[2] * ktm[i][2];
                }
            }
        }
    }

    // interleave
    // src = 64-inch-outch
    // dst = 4a-inch/4a-64-outch;
    kernel_tm_pack4.create(4 * inch / 4, 64, outch / 4 + outch % 4, (size_t)4u * 4, 4);

    int p = 0;
    for (; p + 3 < outch; p += 4)
    {
        const Mat k0 = kernel_tm.channel(p);
        const Mat k1 = kernel_tm.channel(p + 1);
        const Mat k2 = kernel_tm.channel(p + 2);
        const Mat k3 = kernel_tm.channel(p + 3);

        Mat g0 = kernel_tm_pack4.channel(p / 4);

        for (int k = 0; k < 64; k++)
        {
            float* g00 = g0.row(k);

            for (int q = 0; q + 3 < inch; q += 4)
            {
                const float* k00 = k0.row(q);
                const float* k01 = k0.row(q + 1);
                const float* k02 = k0.row(q + 2);
                const float* k03 = k0.row(q + 3);

                const float* k10 = k1.row(q);
                const float* k11 = k1.row(q + 1);
                const float* k12 = k1.row(q + 2);
                const float* k13 = k1.row(q + 3);

                const float* k20 = k2.row(q);
                const float* k21 = k2.row(q + 1);
                const float* k22 = k2.row(q + 2);
                const float* k23 = k2.row(q + 3);

                const float* k30 = k3.row(q);
                const float* k31 = k3.row(q + 1);
                const float* k32 = k3.row(q + 2);
                const float* k33 = k3.row(q + 3);

                g00[0] = k00[k];
                g00[1] = k10[k];
                g00[2] = k20[k];
                g00[3] = k30[k];

                g00[4] = k01[k];
                g00[5] = k11[k];
                g00[6] = k21[k];
                g00[7] = k31[k];

                g00[8] = k02[k];
                g00[9] = k12[k];
                g00[10] = k22[k];
                g00[11] = k32[k];

                g00[12] = k03[k];
                g00[13] = k13[k];
                g00[14] = k23[k];
                g00[15] = k33[k];

                g00 += 16;
            }
        }
    }
    for (; p < outch; p++)
    {
        const Mat k0 = kernel_tm.channel(p);

        Mat g0 = kernel_tm_pack4.channel(p / 4 + p % 4);

        for (int k = 0; k < 64; k++)
        {
            float* g00 = g0.row(k);

            for (int q = 0; q + 3 < inch; q += 4)
            {
                const float* k00 = k0.row(q);
                const float* k01 = k0.row(q + 1);
                const float* k02 = k0.row(q + 2);
                const float* k03 = k0.row(q + 3);

                g00[0] = k00[k];
                g00[1] = k01[k];
                g00[2] = k02[k];
                g00[3] = k03[k];

                g00 += 4;
            }
        }
    }
}